

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

Vector2f __thiscall Rml::ElementHandleTargetData::DistanceToTopLeft(ElementHandleTargetData *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ElementHandleTargetData *this_local;
  
  fVar1 = Element::GetOffsetLeft(this->target);
  fVar2 = Box::GetEdge(this->parent_box,Border,Left);
  fVar3 = Element::GetOffsetTop(this->target);
  fVar4 = Box::GetEdge(this->parent_box,Border,Top);
  Vector2<float>::Vector2((Vector2<float> *)&this_local,fVar1 - fVar2,fVar3 - fVar4);
  return (Vector2f)this_local;
}

Assistant:

Vector2f DistanceToTopLeft() const
	{
		return {target->GetOffsetLeft() - parent_box.GetEdge(BoxArea::Border, BoxEdge::Left),
			target->GetOffsetTop() - parent_box.GetEdge(BoxArea::Border, BoxEdge::Top)};
	}